

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O2

void __thiscall hwnet::TCPSocket::linklist::clear(linklist *this)

{
  sendContext *psVar1;
  sendContext *s;
  
  s = this->head;
  if (this->head != (sendContext *)0x0) {
    while (s != (sendContext *)0x0) {
      psVar1 = s->next;
      putSendContext(s);
      s = psVar1;
    }
    this->head = (sendContext *)0x0;
    this->tail = (sendContext *)0x0;
  }
  return;
}

Assistant:

void clear() {
			if(this->head != nullptr) {
				auto cur = this->head;
				while(cur != nullptr){
					auto c = cur;
					cur = c->next;
					putSendContext(c);
				}
				this->head = this->tail = nullptr;
			}		
		}